

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

void dump_status(void)

{
  FILE *pFVar1;
  schar sVar2;
  schar sVar3;
  schar sVar4;
  char *pcVar5;
  long lVar6;
  uint local_6c;
  uint local_64;
  uint local_54;
  int hp;
  
  pFVar1 = dumpfp;
  pcVar5 = rank_of(u.ulevel,urole.malenum,flags.female);
  fprintf((FILE *)pFVar1,"%s the %s\n",plname,pcVar5);
  fprintf((FILE *)dumpfp,"  Experience level: %d\n",(ulong)(uint)u.ulevel);
  sVar2 = acurr(0);
  pFVar1 = dumpfp;
  if (sVar2 < '\x13') {
    sVar2 = acurr(0);
    fprintf((FILE *)pFVar1,"  Strength: %-1d\n",(ulong)(uint)(int)sVar2);
  }
  else {
    sVar2 = acurr(0);
    pFVar1 = dumpfp;
    if (sVar2 < 'v') {
      sVar2 = acurr(0);
      fprintf((FILE *)pFVar1,"  Strength: 18/%02d\n",(ulong)((int)sVar2 - 0x12));
    }
    else {
      sVar2 = acurr(0);
      pFVar1 = dumpfp;
      if (sVar2 == 'v') {
        fprintf((FILE *)dumpfp,"  Strength: 18/**\n");
      }
      else {
        sVar2 = acurr(0);
        fprintf((FILE *)pFVar1,"  Strength: %-1d\n",(ulong)((int)sVar2 - 100));
      }
    }
  }
  pFVar1 = dumpfp;
  sVar2 = acurr(3);
  sVar3 = acurr(4);
  fprintf((FILE *)pFVar1,"  Dexterity: %-1d\n  Constitution: %-1d\n",(ulong)(uint)(int)sVar2,
          (ulong)(uint)(int)sVar3);
  pFVar1 = dumpfp;
  sVar2 = acurr(1);
  sVar3 = acurr(2);
  sVar4 = acurr(5);
  fprintf((FILE *)pFVar1,"  Intelligence: %-1d\n  Wisdom: %-1d\n  Charisma: %-1d\n",
          (ulong)(uint)(int)sVar2,(ulong)(uint)(int)sVar3,(ulong)(uint)(int)sVar4);
  if (u.umonnum == u.umonster) {
    local_54 = u.uhp;
  }
  else {
    local_54 = u.mh;
  }
  if ((int)local_54 < 0) {
    local_64 = 0;
  }
  else {
    local_64 = local_54;
  }
  if (u.umonnum == u.umonster) {
    local_6c = u.uhpmax;
  }
  else {
    local_6c = u.mhmax;
  }
  fprintf((FILE *)dumpfp,"  Health: %d(%d)\n",(ulong)local_64,(ulong)local_6c);
  fprintf((FILE *)dumpfp,"  Energy: %d(%d)\n",(ulong)(uint)u.uen,(ulong)(uint)u.uenmax);
  fprintf((FILE *)dumpfp,"  AC: %d\n",(ulong)(uint)(int)u.uac);
  pFVar1 = dumpfp;
  lVar6 = money_cnt(invent);
  fprintf((FILE *)pFVar1,"  Gold: %ld\n",lVar6);
  fprintf((FILE *)dumpfp,"  Moves: %u\n",(ulong)moves);
  fprintf((FILE *)dumpfp,"\n\n");
  return;
}

Assistant:

static void dump_status(void)
{
    int hp;
    fprintf(dumpfp, "%s the %s\n", plname, rank_of(u.ulevel, Role_switch, flags.female));
    fprintf(dumpfp, "  Experience level: %d\n", u.ulevel);
    
    if (ACURR(A_STR) > 18) {
	if (ACURR(A_STR) < 118)
	    fprintf(dumpfp, "  Strength: 18/%02d\n", ACURR(A_STR) - 18);
	else if (ACURR(A_STR) == 118)
	    fprintf(dumpfp,"  Strength: 18/**\n");
	else
	    fprintf(dumpfp, "  Strength: %-1d\n", ACURR(A_STR) - 100);
    } else
	fprintf(dumpfp, "  Strength: %-1d\n", ACURR(A_STR));
    
    fprintf(dumpfp, "  Dexterity: %-1d\n  Constitution: %-1d\n", ACURR(A_DEX),
	    ACURR(A_CON));
    fprintf(dumpfp, "  Intelligence: %-1d\n  Wisdom: %-1d\n  Charisma: %-1d\n",
	    ACURR(A_INT), ACURR(A_WIS), ACURR(A_CHA));
    
    hp = Upolyd ? u.mh : u.uhp;
    fprintf(dumpfp, "  Health: %d(%d)\n", hp < 0 ? 0 : hp, Upolyd ? u.mhmax : u.uhpmax);
    fprintf(dumpfp, "  Energy: %d(%d)\n", u.uen, u.uenmax);
    fprintf(dumpfp, "  AC: %d\n", u.uac);
    fprintf(dumpfp, "  Gold: %ld\n", money_cnt(invent));
    fprintf(dumpfp, "  Moves: %u\n", moves);
    
    fprintf(dumpfp, "\n\n");
}